

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

vec3 __thiscall vera::hue2rgb(vera *this,float _hue)

{
  vec3 vVar1;
  int __x;
  float extraout_XMM0_Da;
  float _x;
  float extraout_XMM0_Da_00;
  float _y;
  float extraout_XMM0_Da_01;
  float _z;
  float b;
  float g;
  float r;
  float _hue_local;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_c;
  
  __x = (int)this;
  std::fmod((double)(ulong)(uint)(_hue * 6.0),5.36715732285162e-315);
  std::abs(__x);
  _x = saturate(extraout_XMM0_Da - 1.0);
  std::fmod((double)(ulong)(uint)(_hue * 6.0 + 4.0),5.36715732285162e-315);
  std::abs(__x);
  _y = saturate(extraout_XMM0_Da_00 - 1.0);
  std::fmod((double)(ulong)(uint)(_hue * 6.0 + 2.0),5.36715732285162e-315);
  std::abs(__x);
  _z = saturate(extraout_XMM0_Da_01 - 1.0);
  glm::vec<3,_float,_(glm::qualifier)0>::vec((vec<3,_float,_(glm::qualifier)0> *)&r,_x,_y,_z);
  vVar1.field_2 = local_c;
  vVar1.field_0.x = r;
  vVar1.field_1.y = _hue_local;
  return vVar1;
}

Assistant:

glm::vec3 hue2rgb(float _hue) {
    float r = saturate( abs( fmod( _hue * 6.f, 6.f) - 3.f) - 1.f );
    float g = saturate( abs( fmod( _hue * 6.f + 4.f, 6.f) - 3.f) - 1.f );
    float b = saturate( abs( fmod( _hue * 6.f + 2.f, 6.f) - 3.f) - 1.f );

    #ifdef HSV2RGB_SMOOTH
    r = r*r*(3. - 2. * r);
    g = g*g*(3. - 2. * g);
    b = b*b*(3. - 2. * b);
    #endif

    return glm::vec3(r, g, b);
}